

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSetNonStationary.cpp
# Opt level: O0

void __thiscall BeliefSetNonStationary::~BeliefSetNonStationary(BeliefSetNonStationary *this)

{
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  *this_00;
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  *pvVar1;
  reference pvVar2;
  size_type sVar3;
  reference ppJVar4;
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  *in_RDI;
  Index j;
  Index t;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0;
  while( true ) {
    this_00 = (vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               *)(ulong)local_c;
    pvVar1 = (vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
              *)std::
                vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                ::size(in_RDI);
    if (this_00 == pvVar1) break;
    local_10 = 0;
    while( true ) {
      pvVar2 = std::
               vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               ::operator[](in_RDI,(ulong)local_c);
      sVar3 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::size
                        (pvVar2);
      if (local_10 == sVar3) break;
      pvVar2 = std::
               vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               ::operator[](in_RDI,(ulong)local_c);
      ppJVar4 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
                operator[](pvVar2,(ulong)local_10);
      if (*ppJVar4 != (value_type)0x0) {
        (**(code **)((long)**ppJVar4 + 8))();
      }
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  std::
  vector<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
  ::~vector(this_00);
  return;
}

Assistant:

BeliefSetNonStationary::~BeliefSetNonStationary()
{
    for(Index t=0;t!=_m_beliefSets.size();++t)
        for(Index j=0;j!=_m_beliefSets[t].size();j++)
            delete _m_beliefSets[t][j];
}